

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__decode_uint16_linear_scaled_AR(float *decodep,int width_times_channels,void *inputp)

{
  undefined1 (*pauVar1) [16];
  float *pfVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 (*pauVar8) [16];
  ushort *puVar9;
  float *decode;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  
  pfVar2 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    pfVar10 = decodep;
    if (3 < width_times_channels) {
      do {
        decodep = pfVar10 + 4;
        *pfVar10 = (float)*(ushort *)((long)inputp + 2) * 1.5259022e-05;
        pfVar10[1] = (float)*inputp * 1.5259022e-05;
        pfVar10[2] = (float)*(ushort *)((long)inputp + 6) * 1.5259022e-05;
        pfVar10[3] = (float)*(ushort *)((long)inputp + 4) * 1.5259022e-05;
        inputp = (void *)((long)inputp + 8);
        pfVar11 = pfVar10 + 8;
        pfVar10 = decodep;
      } while (pfVar11 <= pfVar2);
    }
    if (decodep < pfVar2) {
      puVar9 = (ushort *)((long)inputp + 2);
      do {
        *decodep = (float)*puVar9 * 1.5259022e-05;
        decodep[1] = (float)puVar9[-1] * 1.5259022e-05;
        decodep = decodep + 2;
        puVar9 = puVar9 + 2;
      } while (decodep < pfVar2);
    }
  }
  else {
    pauVar8 = (undefined1 (*) [16])((long)inputp + (long)width_times_channels * 2 + -0x10);
    pfVar10 = pfVar2 + -8;
    do {
      pfVar11 = decodep + 8;
      pauVar1 = (undefined1 (*) [16])((long)inputp + 0x10);
      auVar3 = *inputp;
      pfVar12 = pfVar10;
      inputp = pauVar8;
      if (pfVar11 == pfVar2) {
        pfVar12 = pfVar11;
        inputp = pauVar1;
      }
      if (pfVar11 <= pfVar10) {
        inputp = pauVar1;
      }
      auVar4._10_2_ = 0;
      auVar4._0_10_ = auVar3._0_10_;
      auVar4._12_2_ = auVar3._6_2_;
      auVar5._8_2_ = auVar3._4_2_;
      auVar5._0_8_ = auVar3._0_8_;
      auVar5._10_4_ = auVar4._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar5._8_6_;
      auVar6._4_2_ = auVar3._2_2_;
      auVar6._0_4_ = auVar3._0_4_;
      auVar6._6_8_ = SUB148(auVar7 << 0x40,6);
      *decodep = (float)auVar6._4_4_ * 1.5259022e-05;
      decodep[1] = (float)(auVar3._0_4_ & 0xffff) * 1.5259022e-05;
      decodep[2] = (float)(auVar4._10_4_ >> 0x10) * 1.5259022e-05;
      decodep[3] = (float)auVar5._8_4_ * 1.5259022e-05;
      if (pfVar11 <= pfVar10) {
        pfVar12 = pfVar11;
      }
      decodep[4] = (float)auVar3._10_2_ * 1.5259022e-05;
      decodep[5] = (float)auVar3._8_2_ * 1.5259022e-05;
      decodep[6] = (float)auVar3._14_2_ * 1.5259022e-05;
      decodep[7] = (float)auVar3._12_2_ * 1.5259022e-05;
      decodep = pfVar12;
    } while (pfVar11 != pfVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_uint16_linear_scaled)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__simdf8_mult( of, of, STBIR_max_uint16_as_float_inverted8);
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0,o1,i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__simdf_mult( of0, of0, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted) );
      stbir__simdf_mult( of1, of1, STBIR__CONSTF(STBIR_max_uint16_as_float_inverted));
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    decode[1-4] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    decode[2-4] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    decode[3-4] = ((float)(input[stbir__decode_order3])) * stbir__max_uint16_as_float_inverted;
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0])) * stbir__max_uint16_as_float_inverted;
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1])) * stbir__max_uint16_as_float_inverted;
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2])) * stbir__max_uint16_as_float_inverted;
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}